

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseAssertScriptModuleCommand<wabt::AssertModuleCommand<(wabt::CommandType)3>>
          (WastParser *this,TokenType token_type,CommandPtr *out_command)

{
  bool bVar1;
  Result RVar2;
  pointer pAVar3;
  unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)3>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
  local_38;
  unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)3>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
  command;
  CommandPtr *out_command_local;
  TokenType token_type_local;
  WastParser *this_local;
  
  command._M_t.
  super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)3>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)3>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
  .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)3>_*,_false>._M_head_impl.
  _4_4_ = Expect(this,Lpar);
  bVar1 = Failed(command._M_t.
                 super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)3>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)3>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
                 .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)3>_*,_false>.
                 _M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    command._M_t.
    super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)3>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)3>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
    .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)3>_*,_false>._M_head_impl.
    _0_4_ = Expect(this,token_type);
    bVar1 = Failed(command._M_t.
                   super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)3>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)3>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
                   .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)3>_*,_false>.
                   _M_head_impl._0_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      MakeUnique<wabt::AssertModuleCommand<(wabt::CommandType)3>>();
      pAVar3 = std::
               unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)3>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
               ::operator->(&local_38);
      RVar2 = ParseScriptModule(this,&pAVar3->module);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        pAVar3 = std::
                 unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)3>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
                 ::operator->(&local_38);
        RVar2 = ParseQuotedText(this,&pAVar3->text);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          RVar2 = Expect(this,Rpar);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                      ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)out_command,
                       &local_38);
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
      }
      std::
      unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)3>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)3>_>_>
      ::~unique_ptr(&local_38);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseAssertScriptModuleCommand(TokenType token_type,
                                                  CommandPtr* out_command) {
  WABT_TRACE(ParseAssertScriptModuleCommand);
  EXPECT(Lpar);
  CHECK_RESULT(Expect(token_type));
  auto command = MakeUnique<T>();
  CHECK_RESULT(ParseScriptModule(&command->module));
  CHECK_RESULT(ParseQuotedText(&command->text));
  EXPECT(Rpar);
  *out_command = std::move(command);
  return Result::Ok;
}